

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> * __thiscall
fasttext::Meter::scoreVsTrue
          (vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *__range2;
  __node_base *p_Var3;
  int32_t local_1c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->labelMetrics_;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c = labelId;
  if (labelId == -1) {
    p_Var3 = &(this->labelMetrics_)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,(key_type *)(p_Var3 + 1));
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      insert<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,void>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (pmVar2->scoreVsTrue).
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pmVar2->scoreVsTrue).
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    sVar1 = std::
            _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this_00->_M_h,&local_1c);
    if (sVar1 != 0) {
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,&local_1c);
      std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::operator=
                (__return_storage_ptr__,&pmVar2->scoreVsTrue);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->
             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, real>> Meter::scoreVsTrue(int32_t labelId) const {
  std::vector<std::pair<real, real>> ret;
  if (labelId == kAllLabels) {
    for (const auto& k : labelMetrics_) {
      auto& labelScoreVsTrue = labelMetrics_.at(k.first).scoreVsTrue;
      ret.insert(ret.end(), labelScoreVsTrue.begin(), labelScoreVsTrue.end());
    }
  } else {
    if (labelMetrics_.count(labelId)) {
      ret = labelMetrics_.at(labelId).scoreVsTrue;
    }
  }
  sort(ret.begin(), ret.end());

  return ret;
}